

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O3

_Bool av1_compute_global_motion_disflow
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,int downsample_level,MotionModel *motion_models,int num_motion_models,
                _Bool *mem_alloc_failed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ImagePyramid *pyr;
  CornerList *corners;
  ImagePyramid *pyr_00;
  uint8_t *puVar6;
  uint8_t *puVar7;
  double *tmpbuf;
  _Bool _Var8;
  uint uVar9;
  int iVar10;
  undefined8 *memblk;
  void *pvVar11;
  void *pvVar12;
  PyramidLayer *pPVar13;
  Correspondence *matched_points;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  double *pdVar21;
  int iVar22;
  double *pdVar23;
  undefined8 *puVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  ulong local_e0;
  double local_c8 [5];
  long local_a0;
  double *local_98;
  double *local_90;
  ImagePyramid *local_88;
  long local_80;
  double flow_u;
  void *local_70;
  long local_68;
  double *local_60;
  long local_58;
  MotionModel *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  pyr = src->y_pyramid;
  corners = src->corners;
  pyr_00 = ref->y_pyramid;
  local_50 = motion_models;
  uVar9 = aom_compute_pyramid(src,bit_depth,0xc,pyr);
  local_88 = pyr_00;
  iVar10 = aom_compute_pyramid(ref,bit_depth,0xc,pyr_00);
  if ((((int)uVar9 < 0) || (iVar10 < 0)) ||
     (_Var8 = av1_compute_corner_list(src,bit_depth,downsample_level,corners), !_Var8)) {
LAB_002aaef5:
    *mem_alloc_failed = true;
    return false;
  }
  iVar10 = pyr->layers->width;
  iVar17 = pyr->layers->height;
  memblk = (undefined8 *)aom_malloc(0x28);
  if (memblk == (undefined8 *)0x0) goto LAB_002aaef5;
  iVar10 = iVar10 >> 3;
  *(int *)(memblk + 3) = iVar10;
  iVar17 = iVar17 >> 3;
  *(int *)((long)memblk + 0x1c) = iVar17;
  iVar10 = iVar10 + 4;
  *(int *)(memblk + 4) = iVar10;
  lVar26 = (long)(iVar17 + 4) * (long)iVar10;
  pvVar11 = aom_calloc(lVar26 * 2,8);
  *memblk = pvVar11;
  if (pvVar11 == (void *)0x0) {
    aom_free(memblk);
    goto LAB_002aaef5;
  }
  lVar27 = (long)(*(int *)(memblk + 4) * 2);
  local_90 = (double *)((long)pvVar11 + lVar27 * 8 + 0x10);
  memblk[1] = local_90;
  local_98 = (double *)((long)pvVar11 + lVar26 * 8 + 0x10 + lVar27 * 8);
  memblk[2] = local_98;
  if (uVar9 < 2) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar12 = aom_malloc((long)(((pyr->layers[1].height >> 3) + 4) * *(int *)(memblk + 4)) << 3);
    if (pvVar12 == (void *)0x0) {
      _Var8 = false;
      aom_free((void *)0x0);
      *mem_alloc_failed = true;
      aom_free((void *)*memblk);
      goto LAB_002ab6cd;
    }
    local_60 = (double *)((long)*(int *)(memblk + 4) * 0x10 + (long)pvVar12);
    uVar16 = (ulong)uVar9;
    pPVar13 = pyr->layers;
    local_a0 = (long)pvVar11 + lVar27 * 8 + 0x10;
    local_68 = (long)pvVar11 + lVar26 * 8 + 0x10 + lVar27 * 8;
    local_58 = lVar26 * 8;
    local_70 = pvVar12;
    do {
      iVar10 = pPVar13[uVar16 - 1].width;
      iVar17 = pPVar13[uVar16 - 1].height;
      uVar9 = iVar10 >> 3;
      uVar18 = iVar17 >> 3;
      local_80 = (long)*(int *)(memblk + 4);
      local_48 = uVar16;
      if (0 < (int)uVar18) {
        iVar1 = pPVar13[uVar16 - 1].stride;
        puVar6 = pPVar13[uVar16 - 1].buffer;
        puVar7 = local_88->layers[uVar16 - 1].buffer;
        local_38 = (ulong)uVar18;
        local_40 = local_80 * 8;
        local_e0 = 0;
        pdVar21 = local_90;
        pdVar23 = local_98;
        do {
          if (0 < (int)uVar9) {
            lVar26 = 0;
            do {
              (*aom_compute_flow_at_point)
                        (puVar6,puVar7,(int)lVar26,(int)local_e0 * 8,iVar10,iVar17,iVar1,
                         (double *)((long)pdVar21 + lVar26),(double *)((long)pdVar23 + lVar26));
              lVar26 = lVar26 + 8;
            } while ((ulong)uVar9 << 3 != lVar26);
          }
          local_e0 = local_e0 + 1;
          pdVar23 = (double *)((long)pdVar23 + local_40);
          pdVar21 = (double *)((long)pdVar21 + local_40);
        } while (local_e0 != local_38);
      }
      pdVar23 = local_90;
      iVar10 = (int)local_80;
      fill_flow_field_borders(local_90,uVar9,uVar18,iVar10);
      pdVar21 = local_98;
      fill_flow_field_borders(local_98,uVar9,uVar18,iVar10);
      tmpbuf = local_60;
      uVar16 = (long)(int)uVar18 * 2;
      lVar26 = (long)*(int *)(memblk + 4);
      upscale_flow_component(pdVar23,uVar9,uVar18,iVar10,local_60);
      upscale_flow_component(pdVar21,uVar9,uVar18,iVar10,tmpbuf);
      pPVar13 = pyr->layers;
      iVar10 = pPVar13[local_48 - 2].height;
      uVar15 = pPVar13[local_48 - 2].width >> 3;
      if ((0 < (int)uVar18) && ((int)(uVar9 * 2) < (int)uVar15)) {
        uVar20 = uVar16 & 0xffffffff;
        puVar24 = (undefined8 *)(local_a0 + (long)(int)(uVar9 * 2) * 8);
        do {
          *puVar24 = puVar24[-1];
          *(undefined8 *)((long)puVar24 + local_58) = *(undefined8 *)((long)puVar24 + local_58 + -8)
          ;
          puVar24 = puVar24 + lVar26;
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      if ((0 < (int)uVar15) && ((int)uVar16 < iVar10 >> 3)) {
        lVar14 = uVar16 * lVar26;
        lVar26 = lVar14 * 8 + lVar26 * -8;
        lVar27 = 0;
        do {
          *(undefined8 *)(local_a0 + lVar14 * 8 + lVar27) =
               *(undefined8 *)(lVar26 + local_a0 + lVar27);
          *(undefined8 *)(local_68 + lVar14 * 8 + lVar27) =
               *(undefined8 *)(local_68 + lVar26 + lVar27);
          lVar27 = lVar27 + 8;
        } while ((ulong)uVar15 << 3 != lVar27);
      }
      uVar16 = local_48 - 1;
      pvVar11 = local_70;
    } while (2 < (long)local_48);
  }
  aom_free(pvVar11);
  matched_points = (Correspondence *)aom_malloc((long)corners->num_corners << 5);
  if (matched_points == (Correspondence *)0x0) {
    *mem_alloc_failed = true;
    aom_free((void *)*memblk);
    aom_free(memblk);
    return false;
  }
  iVar10 = corners->num_corners;
  if (iVar10 < 1) {
    iVar17 = 0;
  }
  else {
    iVar1 = *(int *)(memblk + 3);
    iVar2 = *(int *)((long)memblk + 0x1c);
    iVar3 = *(int *)(memblk + 4);
    lVar26 = (long)iVar3;
    lVar27 = 0;
    iVar17 = 0;
    do {
      iVar4 = corners->corners[lVar27 * 2];
      uVar9 = iVar4 - 3;
      iVar19 = (int)uVar9 >> 3;
      if ((0 < iVar19) && (iVar19 + 2 < iVar1)) {
        iVar5 = corners->corners[lVar27 * 2 + 1];
        uVar18 = iVar5 - 3;
        iVar22 = (int)uVar18 >> 3;
        if ((0 < iVar22) && (iVar22 + 2 < iVar2)) {
          dVar32 = (double)(uVar9 & 7) * 0.125;
          dVar28 = (double)(uVar18 & 7) * 0.125;
          dVar29 = dVar32 * dVar32;
          dVar34 = dVar32 * dVar29;
          dVar30 = dVar34 * -0.5 + dVar32 * -0.5 + dVar29;
          dVar31 = dVar34 * 1.5 + dVar29 * -2.5 + 1.0;
          dVar33 = dVar34 * -1.5 + dVar32 * 0.5 + dVar29 + dVar29;
          dVar29 = dVar29 * -0.5 + dVar34 * 0.5;
          dVar32 = dVar28 * dVar28;
          lVar14 = (long)(iVar22 * iVar3 + iVar19);
          pdVar21 = (double *)(memblk[1] + lVar26 * -8 + lVar14 * 8);
          lVar25 = 0;
          do {
            local_c8[lVar25] =
                 pdVar21[2] * dVar29 +
                 pdVar21[1] * dVar33 + pdVar21[-1] * dVar30 + *pdVar21 * dVar31;
            lVar25 = lVar25 + 1;
            pdVar21 = pdVar21 + lVar26;
          } while (lVar25 != 4);
          dVar34 = dVar28 * dVar32;
          dVar35 = dVar34 * -0.5 + dVar28 * -0.5 + dVar32;
          dVar36 = dVar34 * 1.5 + dVar32 * -2.5 + 1.0;
          dVar28 = dVar34 * -1.5 + dVar28 * 0.5 + dVar32 + dVar32;
          dVar32 = dVar32 * -0.5 + dVar34 * 0.5;
          flow_u = local_c8[3] * dVar32 +
                   local_c8[2] * dVar28 + local_c8[0] * dVar35 + local_c8[1] * dVar36;
          pdVar21 = (double *)(memblk[2] + lVar26 * -8 + lVar14 * 8);
          lVar14 = 0;
          do {
            local_c8[lVar14] =
                 pdVar21[2] * dVar29 +
                 pdVar21[1] * dVar33 + pdVar21[-1] * dVar30 + *pdVar21 * dVar31;
            lVar14 = lVar14 + 1;
            pdVar21 = pdVar21 + lVar26;
          } while (lVar14 != 4);
          local_c8[0] = dVar32 * local_c8[3] +
                        dVar28 * local_c8[2] + dVar35 * local_c8[0] + dVar36 * local_c8[1];
          pPVar13 = pyr->layers;
          (*aom_compute_flow_at_point)
                    (pPVar13->buffer,local_88->layers->buffer,uVar9,uVar18,pPVar13->width,
                     pPVar13->height,pPVar13->stride,&flow_u,local_c8);
          dVar28 = (double)iVar4;
          dVar29 = (double)iVar5;
          matched_points[iVar17].x = dVar28;
          matched_points[iVar17].y = dVar29;
          matched_points[iVar17].rx = dVar28 + flow_u;
          matched_points[iVar17].ry = dVar29 + local_c8[0];
          iVar17 = iVar17 + 1;
          iVar10 = corners->num_corners;
        }
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < iVar10);
  }
  _Var8 = ransac(matched_points,iVar17,type,local_50,num_motion_models,mem_alloc_failed);
  aom_free(matched_points);
  aom_free((void *)*memblk);
LAB_002ab6cd:
  aom_free(memblk);
  return _Var8;
}

Assistant:

bool av1_compute_global_motion_disflow(
    TransformationType type, YV12_BUFFER_CONFIG *src, YV12_BUFFER_CONFIG *ref,
    int bit_depth, int downsample_level, MotionModel *motion_models,
    int num_motion_models, bool *mem_alloc_failed) {
  // Precompute information we will need about each frame
  ImagePyramid *src_pyramid = src->y_pyramid;
  CornerList *src_corners = src->corners;
  ImagePyramid *ref_pyramid = ref->y_pyramid;

  const int src_layers =
      aom_compute_pyramid(src, bit_depth, DISFLOW_PYRAMID_LEVELS, src_pyramid);
  const int ref_layers =
      aom_compute_pyramid(ref, bit_depth, DISFLOW_PYRAMID_LEVELS, ref_pyramid);

  if (src_layers < 0 || ref_layers < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, src_corners)) {
    *mem_alloc_failed = true;
    return false;
  }

  assert(src_layers == ref_layers);

  const int src_width = src_pyramid->layers[0].width;
  const int src_height = src_pyramid->layers[0].height;
  assert(ref_pyramid->layers[0].width == src_width);
  assert(ref_pyramid->layers[0].height == src_height);

  FlowField *flow = alloc_flow_field(src_width, src_height);
  if (!flow) {
    *mem_alloc_failed = true;
    return false;
  }

  if (!compute_flow_field(src_pyramid, ref_pyramid, src_layers, flow)) {
    *mem_alloc_failed = true;
    free_flow_field(flow);
    return false;
  }

  // find correspondences between the two images using the flow field
  Correspondence *correspondences =
      aom_malloc(src_corners->num_corners * sizeof(*correspondences));
  if (!correspondences) {
    *mem_alloc_failed = true;
    free_flow_field(flow);
    return false;
  }

  const int num_correspondences = determine_disflow_correspondence(
      src_pyramid, ref_pyramid, src_corners, flow, correspondences);

  bool result = ransac(correspondences, num_correspondences, type,
                       motion_models, num_motion_models, mem_alloc_failed);

  aom_free(correspondences);
  free_flow_field(flow);
  return result;
}